

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalOperator::Deserialize(LogicalOperator *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  LogicalOperatorType type;
  pointer pLVar2;
  SerializationException *this_00;
  _func_int **pp_Var3;
  undefined1 local_68 [40];
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  children;
  
  type = Deserializer::ReadProperty<duckdb::LogicalOperatorType>(deserializer,100,"type");
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,true>>
            (&children,deserializer,0x65,"children");
  SerializationData::Set<duckdb::LogicalOperatorType>(&deserializer->data,type);
  this->_vptr_LogicalOperator = (_func_int **)0x0;
  switch(type) {
  case LOGICAL_PROJECTION:
    LogicalProjection::Deserialize((LogicalProjection *)local_68,deserializer);
    break;
  case LOGICAL_FILTER:
    LogicalFilter::Deserialize((LogicalFilter *)local_68,deserializer);
    break;
  case LOGICAL_AGGREGATE_AND_GROUP_BY:
    LogicalAggregate::Deserialize((LogicalAggregate *)local_68,deserializer);
    break;
  case LOGICAL_WINDOW:
    LogicalWindow::Deserialize((LogicalWindow *)local_68,deserializer);
    break;
  case LOGICAL_UNNEST:
    LogicalUnnest::Deserialize((LogicalUnnest *)local_68,deserializer);
    break;
  case LOGICAL_LIMIT:
    LogicalLimit::Deserialize((LogicalLimit *)local_68,deserializer);
    break;
  case LOGICAL_ORDER_BY:
    LogicalOrder::Deserialize((LogicalOrder *)local_68,deserializer);
    break;
  case LOGICAL_TOP_N:
    LogicalTopN::Deserialize((LogicalTopN *)local_68,deserializer);
    break;
  case LOGICAL_TOP_N|LOGICAL_PROJECTION:
  case LOGICAL_SAMPLE|LOGICAL_PROJECTION:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_UPDATE|LOGICAL_PROJECTION):
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_MATERIALIZED_CTE):
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_RECURSIVE_CTE):
  case LOGICAL_JOIN:
switchD_015054c7_caseD_85:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_68,"Unsupported type for deserialization of LogicalOperator!",
               (allocator *)(local_68 + 0x27));
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case LOGICAL_COPY_TO_FILE:
    LogicalCopyToFile::Deserialize((LogicalCopyToFile *)local_68,deserializer);
    goto LAB_015057fa;
  case LOGICAL_DISTINCT:
    LogicalDistinct::Deserialize((LogicalDistinct *)local_68,deserializer);
    break;
  case LOGICAL_SAMPLE:
    LogicalSample::Deserialize((LogicalSample *)local_68,deserializer);
    break;
  case LOGICAL_PIVOT:
    LogicalPivot::Deserialize((LogicalPivot *)local_68,deserializer);
    break;
  case LOGICAL_COPY_DATABASE:
    LogicalCopyDatabase::Deserialize((LogicalCopyDatabase *)local_68,deserializer);
    break;
  case LOGICAL_GET:
    LogicalGet::Deserialize((LogicalGet *)local_68,deserializer);
LAB_015057fa:
    uVar1 = local_68._0_8_;
    local_68._0_8_ = (_func_int **)0x0;
    pp_Var3 = this->_vptr_LogicalOperator;
    this->_vptr_LogicalOperator = (_func_int **)uVar1;
    if (pp_Var3 == (_func_int **)0x0) goto LAB_01505847;
    (**(code **)(*pp_Var3 + 8))();
    pp_Var3 = (_func_int **)local_68._0_8_;
    goto LAB_0150583c;
  case LOGICAL_CHUNK_GET:
    LogicalColumnDataGet::Deserialize((LogicalColumnDataGet *)local_68,deserializer);
    break;
  case LOGICAL_DELIM_GET:
    LogicalDelimGet::Deserialize((LogicalDelimGet *)local_68,deserializer);
    break;
  case LOGICAL_EXPRESSION_GET:
    LogicalExpressionGet::Deserialize((LogicalExpressionGet *)local_68,deserializer);
    break;
  case LOGICAL_DUMMY_SCAN:
    LogicalDummyScan::Deserialize((LogicalDummyScan *)local_68,deserializer);
    break;
  case LOGICAL_EMPTY_RESULT:
    LogicalEmptyResult::Deserialize((LogicalEmptyResult *)local_68,deserializer);
    break;
  case LOGICAL_CTE_REF:
    LogicalCTERef::Deserialize((LogicalCTERef *)local_68,deserializer);
    break;
  case LOGICAL_DELIM_JOIN:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  case LOGICAL_COMPARISON_JOIN:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  case LOGICAL_ANY_JOIN:
    LogicalAnyJoin::Deserialize((LogicalAnyJoin *)local_68,deserializer);
    break;
  case LOGICAL_CROSS_PRODUCT:
    LogicalCrossProduct::Deserialize((Deserializer *)local_68);
    break;
  case LOGICAL_POSITIONAL_JOIN:
    LogicalPositionalJoin::Deserialize((Deserializer *)local_68);
    break;
  case LOGICAL_ASOF_JOIN:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  default:
    switch(type) {
    case LOGICAL_ALTER:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_TABLE:
      LogicalCreateTable::Deserialize((LogicalCreateTable *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_INDEX:
      LogicalCreateIndex::Deserialize((LogicalCreateIndex *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_SEQUENCE:
      LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_VIEW:
      LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_SCHEMA:
      LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_MACRO:
      LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
      break;
    case LOGICAL_DROP:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case LOGICAL_PRAGMA:
    case LOGICAL_ATTACH|LOGICAL_FILTER:
    case LOGICAL_ATTACH|LOGICAL_AGGREGATE_AND_GROUP_BY:
    case LOGICAL_ATTACH|LOGICAL_WINDOW:
    case LOGICAL_ATTACH|LOGICAL_UNNEST:
    case LOGICAL_ATTACH|LOGICAL_LIMIT:
    case LOGICAL_ATTACH|LOGICAL_ORDER_BY:
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x93:
    case 0x94:
    case 0x95:
      goto switchD_015054c7_caseD_85;
    case LOGICAL_TRANSACTION:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case LOGICAL_CREATE_TYPE:
      LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
      break;
    case LOGICAL_ATTACH:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case LOGICAL_DETACH:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case LOGICAL_EXPLAIN:
      LogicalExplain::Deserialize((LogicalExplain *)local_68,deserializer);
      break;
    default:
      switch(type) {
      case LOGICAL_UNION:
        LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
        break;
      case LOGICAL_EXCEPT:
        LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
        break;
      case LOGICAL_INTERSECT:
        LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
        break;
      case LOGICAL_RECURSIVE_CTE:
        LogicalRecursiveCTE::Deserialize((LogicalRecursiveCTE *)local_68,deserializer);
        break;
      case LOGICAL_MATERIALIZED_CTE:
        LogicalMaterializedCTE::Deserialize((LogicalMaterializedCTE *)local_68,deserializer);
        break;
      default:
        switch(type) {
        case LOGICAL_EXPORT:
          LogicalExport::Deserialize((LogicalExport *)local_68,deserializer);
          break;
        case LOGICAL_VACUUM:
          LogicalVacuum::Deserialize((LogicalVacuum *)local_68,deserializer);
          goto LAB_015057fa;
        case LOGICAL_SET:
          LogicalSet::Deserialize((LogicalSet *)local_68,deserializer);
          break;
        case LOGICAL_LOAD:
          LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
          break;
        case LOGICAL_RESET:
          LogicalReset::Deserialize((LogicalReset *)local_68,deserializer);
          break;
        default:
          if (type == LOGICAL_INSERT) {
            LogicalInsert::Deserialize((LogicalInsert *)local_68,deserializer);
          }
          else if (type == LOGICAL_DELETE) {
            LogicalDelete::Deserialize((LogicalDelete *)local_68,deserializer);
          }
          else {
            if (type != LOGICAL_UPDATE) {
              if (type != LOGICAL_EXTENSION_OPERATOR) goto switchD_015054c7_caseD_85;
              LogicalExtensionOperator::Deserialize
                        ((LogicalExtensionOperator *)local_68,deserializer);
              goto LAB_015057fa;
            }
            LogicalUpdate::Deserialize((LogicalUpdate *)local_68,deserializer);
          }
        }
      }
    }
  }
  pp_Var3 = this->_vptr_LogicalOperator;
  this->_vptr_LogicalOperator = (_func_int **)local_68._0_8_;
LAB_0150583c:
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 8))();
  }
LAB_01505847:
  SerializationData::Unset<duckdb::LogicalOperatorType>(&deserializer->data);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)this);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::_M_move_assign(&(pLVar2->children).
                    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ,&children.
                     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  );
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector(&children.
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           );
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalOperator::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<LogicalOperatorType>(100, "type");
	auto children = deserializer.ReadPropertyWithDefault<vector<unique_ptr<LogicalOperator>>>(101, "children");
	deserializer.Set<LogicalOperatorType>(type);
	unique_ptr<LogicalOperator> result;
	switch (type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		result = LogicalAggregate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ALTER:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		result = LogicalAnyJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ATTACH:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CHUNK_GET:
		result = LogicalColumnDataGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COPY_DATABASE:
		result = LogicalCopyDatabase::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COPY_TO_FILE:
		result = LogicalCopyToFile::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_INDEX:
		result = LogicalCreateIndex::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_TABLE:
		result = LogicalCreateTable::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_TYPE:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		result = LogicalCrossProduct::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CTE_REF:
		result = LogicalCTERef::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELETE:
		result = LogicalDelete::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELIM_GET:
		result = LogicalDelimGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DETACH:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DISTINCT:
		result = LogicalDistinct::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DROP:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DUMMY_SCAN:
		result = LogicalDummyScan::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EMPTY_RESULT:
		result = LogicalEmptyResult::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXCEPT:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPLAIN:
		result = LogicalExplain::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPORT:
		result = LogicalExport::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET:
		result = LogicalExpressionGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR:
		result = LogicalExtensionOperator::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_FILTER:
		result = LogicalFilter::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_GET:
		result = LogicalGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_INSERT:
		result = LogicalInsert::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_INTERSECT:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_LIMIT:
		result = LogicalLimit::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_LOAD:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
		result = LogicalMaterializedCTE::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		result = LogicalOrder::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_PIVOT:
		result = LogicalPivot::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		result = LogicalPositionalJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_PROJECTION:
		result = LogicalProjection::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
		result = LogicalRecursiveCTE::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_RESET:
		result = LogicalReset::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_SAMPLE:
		result = LogicalSample::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_SET:
		result = LogicalSet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_TOP_N:
		result = LogicalTopN::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_TRANSACTION:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UNION:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UNNEST:
		result = LogicalUnnest::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UPDATE:
		result = LogicalUpdate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_VACUUM:
		result = LogicalVacuum::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_WINDOW:
		result = LogicalWindow::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of LogicalOperator!");
	}
	deserializer.Unset<LogicalOperatorType>();
	result->children = std::move(children);
	return result;
}